

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::Search_Digits_OnePass(int i)

{
  StringPiece s;
  StringPiece local_20;
  
  local_20.ptr_ = "650-253-0001";
  local_20.length_ = 0xc;
  BenchmarkMemoryUsage();
  SearchOnePass(i,"([0-9]+)-([0-9]+)-([0-9]+)",&local_20,kAnchored,true);
  SetBenchmarkItemsProcessed(i);
  return;
}

Assistant:

void Search_Digits_OnePass(int i)     { SearchDigits(i, SearchOnePass); }